

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O3

int raw_find_str(memptr *raw_value,char *str)

{
  char cVar1;
  int iVar2;
  __int32_t **pp_Var3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  char cVar8;
  
  pcVar6 = raw_value->buf;
  sVar4 = raw_value->length;
  cVar1 = pcVar6[sVar4];
  cVar8 = *pcVar6;
  if (cVar8 != '\0') {
    lVar7 = 1;
    pp_Var3 = __ctype_tolower_loc();
    pcVar5 = pcVar6;
    do {
      *pcVar5 = (char)(*pp_Var3)[cVar8];
      pcVar6 = raw_value->buf;
      pcVar5 = pcVar6 + lVar7;
      cVar8 = pcVar6[lVar7];
      lVar7 = lVar7 + 1;
    } while (cVar8 != '\0');
    sVar4 = raw_value->length;
  }
  pcVar6[sVar4] = '\0';
  pcVar6 = raw_value->buf;
  pcVar5 = strstr(pcVar6,str);
  pcVar6[raw_value->length] = cVar1;
  if (pcVar5 == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = (int)pcVar5 - *(int *)&raw_value->buf;
  }
  return iVar2;
}

Assistant:

int raw_find_str(memptr *raw_value, const char *str)
{
	char c;
	char *ptr;
	int i = 0;

	/* save */
	c = raw_value->buf[raw_value->length];

	/* Make it lowercase */
	for (i = 0; raw_value->buf[i]; ++i) {
		raw_value->buf[i] = (char)tolower(raw_value->buf[i]);
	}

	/* null-terminate */
	raw_value->buf[raw_value->length] = 0;

	/* Find the substring position */
	ptr = strstr(raw_value->buf, str);

	/* restore the "length" byte */
	raw_value->buf[raw_value->length] = c;

	if (ptr == 0) {
		return -1;
	}

	/* return index */
	return (int)(ptr - raw_value->buf);
}